

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void utrie2_freeze_63(UTrie2 *trie,UTrie2ValueBits valueBits,UErrorCode *pErrorCode)

{
  int32_t *piVar1;
  uint32_t uVar2;
  UNewTrie2 *buffer;
  short sVar3;
  int32_t iVar4;
  UBool UVar5;
  int iVar6;
  int iVar7;
  int32_t *piVar8;
  undefined4 *puVar9;
  uint32_t *puVar10;
  uint uVar11;
  uint32_t *puVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  int iVar15;
  long lVar16;
  int32_t *piVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  uint local_8c;
  int local_88;
  uint32_t local_78;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (trie == (UTrie2 *)0x0 || UTRIE2_32_VALUE_BITS < valueBits) {
LAB_001b8380:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  buffer = trie->newTrie;
  if (buffer == (UNewTrie2 *)0x0) {
    if ((trie->data16 == (uint16_t *)0x0) == valueBits) {
      return;
    }
    goto LAB_001b8380;
  }
  if (buffer->isCompacted == '\0') {
    local_78 = utrie2_get32_63(trie,0x10ffff);
    uVar2 = buffer->initialValue;
    iVar15 = -1;
    if (uVar2 == local_78) {
      iVar15 = buffer->index2NullOffset;
    }
    iVar23 = -1;
    if (uVar2 == local_78) {
      iVar23 = buffer->dataNullOffset;
    }
    piVar17 = buffer->index2;
    iVar6 = 0x110000;
    lVar16 = 0x220;
LAB_001b844b:
    lVar25 = 0x40;
    lVar20 = (long)(int)lVar16;
    while( true ) {
      lVar16 = lVar20 + -1;
      if (iVar6 < 1) {
        buffer->highStart = 0;
        trie->highStart = 0;
        uVar18 = 0;
        goto LAB_001b850f;
      }
      iVar7 = buffer->index1[lVar20 + -1];
      if (iVar7 != iVar15) break;
      iVar6 = iVar6 + -0x800;
      lVar20 = lVar16;
    }
    iVar15 = iVar7;
    if (iVar7 == buffer->index2NullOffset) {
      if (uVar2 != local_78) goto LAB_001b8cdf;
      iVar6 = iVar6 + -0x800;
      goto LAB_001b844b;
    }
    while( true ) {
      while( true ) {
        lVar20 = 0x1f;
        lVar25 = (long)(int)lVar25;
        while( true ) {
          if (lVar25 < 1) goto LAB_001b844b;
          iVar19 = buffer->index2[(long)iVar7 + lVar25 + -1];
          if (iVar19 != iVar23) break;
          iVar6 = iVar6 + -0x20;
          lVar25 = lVar25 + -1;
        }
        lVar25 = lVar25 + -1;
        iVar23 = iVar19;
        if (iVar19 == buffer->dataNullOffset) break;
        for (; lVar20 != -1; lVar20 = lVar20 + -1) {
          if (buffer->data[iVar19 + lVar20] != local_78) goto LAB_001b8cdf;
          iVar6 = iVar6 + -1;
        }
      }
      if (uVar2 != local_78) break;
      iVar6 = iVar6 + -0x20;
    }
LAB_001b8cdf:
    uVar18 = iVar6 + 0x7ffU & 0xfffff800;
    if (uVar18 == 0x110000) {
      local_78 = trie->errorValue;
      uVar18 = 0x110000;
      buffer->highStart = 0x110000;
      trie->highStart = 0x110000;
    }
    else {
      buffer->highStart = uVar18;
      trie->highStart = uVar18;
      if ((int)uVar18 < 0x110000) {
LAB_001b850f:
        uVar11 = 0x10000;
        if (0x10000 < (int)uVar18) {
          uVar11 = uVar18;
        }
        utrie2_setRange32_63(trie,uVar11,0x10ffff,trie->initialValue,'\x01',pErrorCode);
        if (U_ZERO_ERROR < *pErrorCode) {
          return;
        }
      }
    }
    piVar1 = buffer->map;
    piVar8 = piVar1;
    for (lVar16 = 0; lVar16 != 0xc0; lVar16 = lVar16 + 0x20) {
      *piVar8 = (int32_t)lVar16;
      piVar8 = piVar8 + 1;
    }
    iVar15 = 2;
    local_8c = 0x40;
    iVar23 = 0xc0;
    local_88 = 0xc0;
LAB_001b85f2:
    while (iVar23 < buffer->dataLength) {
      if (iVar23 == 0x880) {
        local_8c = 0x20;
      }
      if (iVar23 == 0x880) {
        iVar15 = 1;
      }
      iVar6 = iVar23 >> 5;
      if (piVar1[iVar6] < 1) {
LAB_001b86f0:
        iVar23 = iVar23 + local_8c;
      }
      else {
        puVar10 = buffer->data;
        puVar12 = puVar10;
        for (uVar21 = 0; (long)uVar21 <= (long)(int)(local_88 - local_8c); uVar21 = uVar21 + 4) {
          UVar5 = equal_uint32(puVar12,puVar10 + iVar23,local_8c);
          if (UVar5 != '\0') {
            piVar8 = buffer->map + iVar6;
            for (iVar6 = iVar15; 0 < iVar6; iVar6 = iVar6 + -1) {
              *piVar8 = (int)uVar21;
              uVar21 = (ulong)((int)uVar21 + 0x20);
              piVar8 = piVar8 + 1;
            }
            goto LAB_001b86f0;
          }
          puVar12 = puVar12 + 4;
        }
        puVar12 = puVar10 + ((long)local_88 - (ulong)local_8c);
        uVar21 = (ulong)local_8c;
        while (uVar22 = uVar21, puVar12 = puVar12 + 4, 4 < (long)uVar22) {
          UVar5 = equal_uint32(puVar12,puVar10 + iVar23,(int32_t)(uVar22 - 4));
          uVar21 = uVar22 - 4;
          if (UVar5 != '\0') goto LAB_001b8705;
        }
        if (local_88 < iVar23) goto LAB_001b8705;
        piVar8 = buffer->map + iVar6;
        for (iVar6 = iVar15; local_88 = iVar23, 0 < iVar6; iVar6 = iVar6 + -1) {
          *piVar8 = iVar23;
          iVar23 = iVar23 + 0x20;
          piVar8 = piVar8 + 1;
        }
      }
    }
    uVar21 = (ulong)local_88;
    for (iVar15 = 0; iVar15 < buffer->index2Length; iVar15 = iVar15 + 1) {
      if (iVar15 == 0x820) {
        iVar15 = 0xa60;
      }
      piVar17[iVar15] = piVar1[piVar17[iVar15] >> 5];
    }
    buffer->dataNullOffset = buffer->map[buffer->dataNullOffset >> 5];
    for (; (uVar21 & 3) != 0; uVar21 = uVar21 + 1) {
      buffer->data[uVar21] = buffer->initialValue;
    }
    local_88 = (-local_88 & 3U) + local_88;
    buffer->dataLength = local_88;
    if ((int)uVar18 < 0x10001) {
LAB_001b8a7c:
      puVar10 = buffer->data;
      buffer->dataLength = local_88 + 1;
      uVar21 = (ulong)local_88;
      while( true ) {
        puVar10[uVar21] = local_78;
        uVar21 = (ulong)buffer->dataLength;
        if ((uVar21 & 3) == 0) break;
        local_78 = trie->initialValue;
        buffer->dataLength = buffer->dataLength + 1;
      }
      buffer->isCompacted = '\x01';
      if (U_ZERO_ERROR < *pErrorCode) {
        return;
      }
      goto LAB_001b83ad;
    }
    piVar8 = piVar1;
    for (lVar16 = 0; lVar16 != 0x840; lVar16 = lVar16 + 0x40) {
      *piVar8 = (int32_t)lVar16;
      piVar8 = piVar8 + 1;
    }
    iVar23 = (buffer->highStart + -0x10000 >> 0xb) + 0x840;
    iVar15 = 0xa60;
LAB_001b88a9:
    iVar6 = 0x3f;
    if (0x3f < iVar23) {
      iVar6 = iVar23;
    }
    for (lVar16 = (long)iVar15; lVar16 < buffer->index2Length; lVar16 = lVar16 + 0x40) {
      uVar21 = 0;
      piVar8 = piVar17;
      while( true ) {
        iVar7 = (int)lVar16;
        iVar19 = iVar7 >> 6;
        if (iVar6 - 0x3f == uVar21) {
          piVar8 = buffer->index1 + (long)iVar23 + 0x1e1;
          iVar6 = -0x40;
          lVar20 = 0x3f;
          goto LAB_001b8950;
        }
        UVar5 = equal_int32(piVar8,piVar17 + lVar16,0x40);
        if (UVar5 != '\0') break;
        uVar21 = uVar21 + 1;
        piVar8 = piVar8 + 1;
      }
      piVar1[iVar19] = (int32_t)uVar21;
      iVar15 = iVar15 + 0x40;
    }
    uVar21 = (ulong)iVar23;
    for (lVar16 = 0; lVar16 != 0x220; lVar16 = lVar16 + 1) {
      buffer->index1[lVar16] = buffer->map[buffer->index1[lVar16] >> 6];
    }
    buffer->index2NullOffset = buffer->map[buffer->index2NullOffset >> 6];
    for (; (uVar21 & 3) != 0; uVar21 = uVar21 + 1) {
      piVar17[uVar21] = 0x3fffc;
    }
    buffer->index2Length = (-iVar23 & 3U) + iVar23;
    local_88 = buffer->dataLength;
    goto LAB_001b8a7c;
  }
LAB_001b83ad:
  uVar18 = trie->highStart;
  if ((int)uVar18 < 0x10001) {
    iVar23 = 0;
    iVar15 = 0x840;
    if (valueBits == UTRIE2_16_VALUE_BITS) {
      iVar23 = 0x840;
    }
  }
  else {
    iVar15 = buffer->index2Length;
    iVar23 = 0;
    if (valueBits == UTRIE2_16_VALUE_BITS) {
      iVar23 = iVar15;
    }
    if (0xffff < iVar15) goto LAB_001b85aa;
  }
  if (((iVar23 < 0xf780) && (buffer->dataNullOffset + iVar23 < 0x10000)) &&
     (iVar6 = buffer->dataLength, iVar6 + iVar23 < 0x3fffd)) {
    if (valueBits == UTRIE2_16_VALUE_BITS) {
      iVar6 = (iVar6 + iVar15) * 2;
    }
    else {
      iVar6 = iVar6 * 4 + iVar15 * 2;
    }
    puVar9 = (undefined4 *)uprv_malloc_63((long)(iVar6 + 0x10));
    trie->memory = puVar9;
    if (puVar9 != (undefined4 *)0x0) {
      trie->length = iVar6 + 0x10;
      trie->isMemoryOwned = '\x01';
      trie->indexLength = iVar15;
      uVar11 = buffer->dataLength;
      trie->dataLength = uVar11;
      uVar13 = 0xffff;
      if (0x10000 < (int)uVar18) {
        uVar13 = (uint16_t)buffer->index2NullOffset;
      }
      trie->index2NullOffset = uVar13;
      sVar3 = (short)iVar23;
      uVar14 = (short)buffer->dataNullOffset + sVar3;
      trie->dataNullOffset = uVar14;
      trie->highValueIndex = iVar23 + uVar11 + -4;
      *puVar9 = 0x54726932;
      *(short *)(puVar9 + 1) = (short)valueBits;
      *(short *)((long)puVar9 + 6) = (short)iVar15;
      *(short *)(puVar9 + 2) = (short)(uVar11 >> 2);
      *(uint16_t *)((long)puVar9 + 10) = uVar13;
      *(uint16_t *)(puVar9 + 3) = uVar14;
      *(short *)((long)puVar9 + 0xe) = (short)(uVar18 >> 0xb);
      trie->index = (uint16_t *)(puVar9 + 4);
      puVar10 = puVar9 + 5;
      for (lVar16 = 0x220; (int)lVar16 != 0xa40; lVar16 = lVar16 + 1) {
        *(short *)(puVar10 + -1) = (short)((uint)(buffer->index1[lVar16] + iVar23) >> 2);
        puVar10 = (uint32_t *)((long)puVar10 + 2);
      }
      *(short *)(puVar10 + -1) = sVar3 + 0x80;
      *(short *)((long)puVar10 + -2) = sVar3 + 0x80;
      for (lVar16 = 0x112; lVar16 != 0x130; lVar16 = lVar16 + 1) {
        *(short *)puVar10 = (short)buffer->index1[lVar16 * 2] + sVar3;
        puVar10 = (uint32_t *)((long)puVar10 + 2);
      }
      if (0x10000 < (int)uVar18) {
        piVar17 = buffer->index1 + 0x20;
        uVar24 = uVar18 - 0x10000 >> 0xb;
        for (uVar18 = uVar24; 0 < (int)uVar18; uVar18 = uVar18 - 1) {
          iVar4 = *piVar17;
          piVar17 = piVar17 + 1;
          *(short *)puVar10 = (short)iVar4;
          puVar10 = (uint32_t *)((long)puVar10 + 2);
        }
        uVar24 = uVar24 + 0x840;
        lVar16 = 0;
        for (iVar15 = buffer->index2Length - uVar24; 0 < iVar15; iVar15 = iVar15 + -1) {
          *(short *)((long)puVar10 + lVar16) =
               (short)((uint)(*(int *)((long)buffer->index2 + lVar16 * 2 + (ulong)uVar24 * 4) +
                             iVar23) >> 2);
          lVar16 = lVar16 + 2;
        }
        puVar10 = (uint32_t *)((long)puVar10 + lVar16);
      }
      if ((valueBits & UTRIE2_32_VALUE_BITS) == UTRIE2_16_VALUE_BITS) {
        trie->data16 = (uint16_t *)puVar10;
        trie->data32 = (uint32_t *)0x0;
        puVar12 = buffer->data;
        lVar16 = 0;
        for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
          *(undefined2 *)((long)puVar10 + lVar16) = *(undefined2 *)((long)puVar12 + lVar16 * 2);
          lVar16 = lVar16 + 2;
        }
      }
      else {
        trie->data16 = (uint16_t *)0x0;
        trie->data32 = puVar10;
        memcpy(puVar10,buffer->data,(long)(int)uVar11 << 2);
        puVar12 = buffer->data;
      }
      uprv_free_63(puVar12);
      uprv_free_63(buffer);
      trie->newTrie = (UNewTrie2 *)0x0;
      return;
    }
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
LAB_001b85aa:
  *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  return;
LAB_001b8705:
  iVar19 = (int)uVar22 + -4;
  iVar7 = local_88 - iVar19;
  piVar8 = buffer->map + iVar6;
  for (iVar6 = iVar15; 0 < iVar6; iVar6 = iVar6 + -1) {
    *piVar8 = iVar7;
    iVar7 = iVar7 + 0x20;
    piVar8 = piVar8 + 1;
  }
  for (iVar6 = 0; 0 < (int)((local_8c - iVar19) + iVar6); iVar6 = iVar6 + -1) {
    puVar10[local_88] = puVar10[iVar23 + iVar19];
    puVar10 = puVar10 + 1;
  }
  iVar23 = (iVar23 + iVar19) - iVar6;
  local_88 = local_88 - iVar6;
  goto LAB_001b85f2;
  while( true ) {
    UVar5 = equal_int32(piVar8,piVar17 + lVar16,(int32_t)lVar20);
    iVar6 = iVar6 + 1;
    piVar8 = piVar8 + 1;
    lVar20 = lVar20 + -1;
    if (UVar5 != '\0') break;
LAB_001b8950:
    if (lVar20 == 0) {
      iVar6 = 0;
      if (iVar23 < iVar7) goto LAB_001b898d;
      piVar1[iVar19] = iVar7;
      iVar23 = iVar7 + 0x40;
      iVar15 = iVar23;
      goto LAB_001b88a9;
    }
  }
  iVar6 = -iVar6;
LAB_001b898d:
  piVar1[iVar19] = iVar23 - iVar6;
  piVar8 = piVar17;
  for (iVar7 = 0; 0 < (0x40 - iVar6) + iVar7; iVar7 = iVar7 + -1) {
    piVar8[iVar23] = piVar8[iVar15 + iVar6];
    piVar8 = piVar8 + 1;
  }
  iVar23 = iVar23 - iVar7;
  iVar15 = (iVar15 + iVar6) - iVar7;
  goto LAB_001b88a9;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }